

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(Cast *this,hugeint_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  hugeint_t hVar2;
  hugeint_t hVar3;
  hugeint_t result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  hVar2.upper = input.lower;
  hVar2.lower = (uint64_t)this;
  bVar1 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar2,&result,false);
  if (bVar1) {
    return result;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_e0);
  std::operator+(&local_c0,"Type ",&local_e0);
  std::operator+(&local_a0,&local_c0," with value ");
  hVar3.upper = (int64_t)this;
  hVar3.lower = (uint64_t)&local_100;
  duckdb::ConvertToString::Operation<duckdb::hugeint_t>(hVar3);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,
                 " can\'t be cast because the value is out of range for the destination type ");
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_120);
  std::operator+(&local_40,&local_60,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  duckdb::InvalidInputException::InvalidInputException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}